

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

xmlChar * xmlCatalogListXMLResolve(xmlCatalogEntryPtr catal,xmlChar *pubID,xmlChar *sysID)

{
  xmlCatalogEntryType xVar1;
  xmlGenericErrorFunc p_Var2;
  int iVar3;
  int iVar4;
  xmlChar *pxVar5;
  xmlGenericErrorFunc *pp_Var6;
  void **ppvVar7;
  xmlChar *pxVar8;
  xmlChar *str2;
  long lVar9;
  uint uVar10;
  int iVar11;
  char *pcVar12;
  _xmlCatalogEntry *catal_00;
  xmlCatalogEntryPtr pxVar13;
  _xmlCatalogEntry *p_Var14;
  ulong uVar15;
  ulong uVar16;
  xmlCatalogEntryPtr local_1e0;
  xmlChar *delegates [50];
  
  if ((catal == (xmlCatalogEntryPtr)0x0) || (pubID == (xmlChar *)0x0 && sysID == (xmlChar *)0x0)) {
    return (xmlChar *)0x0;
  }
  pxVar5 = xmlCatalogNormalizePublic(pubID);
  if ((pxVar5 != (xmlChar *)0x0) && (pubID = (xmlChar *)0x0, *pxVar5 != '\0')) {
    pubID = pxVar5;
  }
  iVar3 = xmlStrncmp(pubID,(xmlChar *)"urn:publicid:",0xd);
  if (iVar3 == 0) {
    str2 = xmlCatalogUnWrapURN(pubID);
    pxVar8 = str2;
    if (xmlDebugCatalogs != 0) {
      pp_Var6 = __xmlGenericError();
      p_Var2 = *pp_Var6;
      ppvVar7 = __xmlGenericErrorContext();
      if (str2 == (xmlChar *)0x0) {
        pcVar12 = "Public URN ID %s expanded to NULL\n";
      }
      else {
        pcVar12 = "Public URN ID expanded to %s\n";
        pubID = str2;
      }
      (*p_Var2)(*ppvVar7,pcVar12,pubID);
    }
  }
  else {
    iVar3 = xmlStrncmp(sysID,(xmlChar *)"urn:publicid:",0xd);
    if (iVar3 != 0) {
      for (; catal != (xmlCatalogEntryPtr)0x0; catal = catal->next) {
        if (catal->type == XML_CATA_CATALOG) {
          catal_00 = catal->children;
          if (catal_00 == (_xmlCatalogEntry *)0x0) {
            xmlFetchXMLCatalogFile(catal);
            catal_00 = catal->children;
            if (catal_00 == (_xmlCatalogEntry *)0x0) goto LAB_0013a16d;
          }
          if (catal_00->depth < 0x33) {
            catal_00->depth = catal_00->depth + 1;
            if (sysID == (xmlChar *)0x0) {
              iVar3 = 0;
            }
            else {
              iVar11 = 0;
              iVar3 = 0;
              local_1e0 = (xmlCatalogEntryPtr)0x0;
              uVar16 = 0;
              for (p_Var14 = catal_00; p_Var14 != (xmlCatalogEntryPtr)0x0; p_Var14 = p_Var14->next)
              {
                switch(p_Var14->type) {
                case XML_CATA_NEXT_CATALOG:
                  iVar3 = iVar3 + 1;
                  break;
                case XML_CATA_SYSTEM:
                  iVar4 = xmlStrEqual(sysID,p_Var14->name);
                  if (iVar4 != 0) {
                    if (xmlDebugCatalogs != 0) {
                      pp_Var6 = __xmlGenericError();
                      p_Var2 = *pp_Var6;
                      ppvVar7 = __xmlGenericErrorContext();
                      (*p_Var2)(*ppvVar7,"Found system match %s, using %s\n",p_Var14->name,
                                p_Var14->URL);
                    }
                    catal_00->depth = catal_00->depth + -1;
                    pxVar8 = xmlStrdup(p_Var14->URL);
                    goto LAB_0013a150;
                  }
                  break;
                case XML_CATA_REWRITE_SYSTEM:
                  uVar10 = xmlStrlen(p_Var14->name);
                  if (((int)uVar16 < (int)uVar10) &&
                     (iVar4 = xmlStrncmp(sysID,p_Var14->name,uVar10), iVar4 == 0)) {
                    uVar16 = (ulong)uVar10;
                    local_1e0 = p_Var14;
                  }
                  break;
                case XML_CATA_DELEGATE_SYSTEM:
                  pxVar8 = p_Var14->name;
                  iVar4 = xmlStrlen(pxVar8);
                  iVar4 = xmlStrncmp(sysID,pxVar8,iVar4);
                  iVar11 = iVar11 + (uint)(iVar4 == 0);
                }
              }
              if (local_1e0 != (xmlCatalogEntryPtr)0x0) {
                if (xmlDebugCatalogs != 0) {
                  pp_Var6 = __xmlGenericError();
                  p_Var2 = *pp_Var6;
                  ppvVar7 = __xmlGenericErrorContext();
                  (*p_Var2)(*ppvVar7,"Using rewriting rule %s\n",local_1e0->name);
                }
                pxVar8 = xmlStrdup(local_1e0->URL);
                if (pxVar8 == (xmlChar *)0x0) {
                  pxVar8 = (xmlChar *)0x0;
                }
                else {
                  pxVar8 = xmlStrcat(pxVar8,sysID + uVar16);
                }
                catal_00->depth = catal_00->depth + -1;
LAB_0013a150:
                if (pxVar8 == (xmlChar *)0x0) goto LAB_0013a159;
                goto LAB_0013a260;
              }
              if (iVar11 != 0) {
                uVar10 = 0;
                p_Var14 = catal_00;
                goto LAB_0013a395;
              }
            }
            if (pubID != (xmlChar *)0x0) {
              iVar11 = 0;
              for (p_Var14 = catal_00; p_Var14 != (xmlCatalogEntryPtr)0x0; p_Var14 = p_Var14->next)
              {
                xVar1 = p_Var14->type;
                if (xVar1 == XML_CATA_NEXT_CATALOG) {
                  iVar3 = iVar3 + (uint)(sysID == (xmlChar *)0x0);
                }
                else if (xVar1 == XML_CATA_DELEGATE_PUBLIC) {
                  pxVar8 = p_Var14->name;
                  iVar4 = xmlStrlen(pxVar8);
                  iVar4 = xmlStrncmp(pubID,pxVar8,iVar4);
                  if (iVar4 == 0) {
                    iVar11 = iVar11 + (uint)(p_Var14->prefer == XML_CATA_PREFER_PUBLIC);
                  }
                }
                else if ((xVar1 == XML_CATA_PUBLIC) &&
                        (iVar4 = xmlStrEqual(pubID,p_Var14->name), iVar4 != 0)) {
                  if (xmlDebugCatalogs != 0) {
                    pp_Var6 = __xmlGenericError();
                    p_Var2 = *pp_Var6;
                    ppvVar7 = __xmlGenericErrorContext();
                    (*p_Var2)(*ppvVar7,"Found public match %s\n",p_Var14->name);
                  }
                  catal_00->depth = catal_00->depth + -1;
                  pxVar8 = xmlStrdup(p_Var14->URL);
                  goto LAB_0013a150;
                }
              }
              if (iVar11 != 0) {
                uVar10 = 0;
                p_Var14 = catal_00;
                goto LAB_0013a297;
              }
            }
            p_Var14 = catal_00;
            if (iVar3 != 0) {
              for (; p_Var14 != (xmlCatalogEntryPtr)0x0; p_Var14 = p_Var14->next) {
                if (p_Var14->type == XML_CATA_NEXT_CATALOG) {
                  pxVar13 = p_Var14->children;
                  if (pxVar13 == (xmlCatalogEntryPtr)0x0) {
                    xmlFetchXMLCatalogFile(p_Var14);
                    pxVar13 = p_Var14->children;
                    if (pxVar13 == (xmlCatalogEntryPtr)0x0) goto LAB_0013a0ab;
                  }
                  pxVar8 = xmlCatalogListXMLResolve(pxVar13,pubID,sysID);
                  if (pxVar8 != (xmlChar *)0x0) {
                    catal_00->depth = catal_00->depth + -1;
                    goto LAB_0013a260;
                  }
                  if (0x32 < catal_00->depth) goto LAB_0013a159;
                }
LAB_0013a0ab:
              }
            }
            catal_00->depth = catal_00->depth + -1;
          }
          else {
            xmlCatalogErr(catal_00,(xmlNodePtr)0x0,0x676,"Detected recursion in catalog %s\n",
                          catal_00->name,(xmlChar *)0x0,(xmlChar *)0x0);
          }
LAB_0013a159:
          if (0x32 < catal->children->depth) break;
        }
LAB_0013a16d:
      }
      pxVar8 = (xmlChar *)0x0;
      goto LAB_0013a260;
    }
    str2 = xmlCatalogUnWrapURN(sysID);
    if (xmlDebugCatalogs != 0) {
      pp_Var6 = __xmlGenericError();
      p_Var2 = *pp_Var6;
      ppvVar7 = __xmlGenericErrorContext();
      if (str2 == (xmlChar *)0x0) {
        pcVar12 = "System URN ID %s expanded to NULL\n";
      }
      else {
        pcVar12 = "System URN ID expanded to %s\n";
        sysID = str2;
      }
      (*p_Var2)(*ppvVar7,pcVar12,sysID);
    }
    pxVar8 = str2;
    if ((pubID == (xmlChar *)0x0) ||
       (iVar3 = xmlStrEqual(pubID,str2), sysID = str2, pxVar8 = pubID, iVar3 != 0)) {
      sysID = (xmlChar *)0x0;
    }
  }
  pxVar8 = xmlCatalogListXMLResolve(catal,pxVar8,sysID);
  if (str2 != (xmlChar *)0x0) {
    (*xmlFree)(str2);
  }
LAB_0013a260:
  if (pxVar5 != (xmlChar *)0x0) {
    (*xmlFree)(pxVar5);
  }
  return pxVar8;
LAB_0013a395:
  uVar16 = 0;
  if (0 < (int)uVar10) {
    uVar16 = (ulong)uVar10;
  }
  for (; pxVar8 = (xmlChar *)0xffffffffffffffff, p_Var14 != (xmlCatalogEntryPtr)0x0;
      p_Var14 = p_Var14->next) {
    if (p_Var14->type != XML_CATA_DELEGATE_SYSTEM) goto LAB_0013a46c;
    pxVar8 = p_Var14->name;
    iVar3 = xmlStrlen(pxVar8);
    iVar3 = xmlStrncmp(sysID,pxVar8,iVar3);
    if (iVar3 != 0) goto LAB_0013a46c;
    uVar15 = 0;
    do {
      if (uVar16 == uVar15) {
        if ((int)uVar10 < 0x32) {
          lVar9 = (long)(int)uVar10;
          uVar10 = uVar10 + 1;
          delegates[lVar9] = p_Var14->URL;
        }
        pxVar13 = p_Var14->children;
        if (pxVar13 == (xmlCatalogEntryPtr)0x0) {
          xmlFetchXMLCatalogFile(p_Var14);
          pxVar13 = p_Var14->children;
          if (pxVar13 == (xmlCatalogEntryPtr)0x0) goto LAB_0013a46c;
        }
        if (xmlDebugCatalogs != 0) {
          pp_Var6 = __xmlGenericError();
          p_Var2 = *pp_Var6;
          ppvVar7 = __xmlGenericErrorContext();
          (*p_Var2)(*ppvVar7,"Trying system delegate %s\n",p_Var14->URL);
          pxVar13 = p_Var14->children;
        }
        pxVar8 = xmlCatalogListXMLResolve(pxVar13,(xmlChar *)0x0,sysID);
        if (pxVar8 != (xmlChar *)0x0) goto LAB_0013a494;
        goto LAB_0013a46c;
      }
      iVar3 = xmlStrEqual(p_Var14->URL,delegates[uVar15]);
      uVar15 = uVar15 + 1;
    } while (iVar3 == 0);
  }
LAB_0013a494:
  catal_00->depth = catal_00->depth + -1;
  goto LAB_0013a260;
LAB_0013a46c:
  p_Var14 = p_Var14->next;
  goto LAB_0013a395;
LAB_0013a297:
  uVar16 = 0;
  if (0 < (int)uVar10) {
    uVar16 = (ulong)uVar10;
  }
  for (; pxVar8 = (xmlChar *)0xffffffffffffffff, p_Var14 != (xmlCatalogEntryPtr)0x0;
      p_Var14 = p_Var14->next) {
    if ((p_Var14->type != XML_CATA_DELEGATE_PUBLIC) || (p_Var14->prefer != XML_CATA_PREFER_PUBLIC))
    goto LAB_0013a37b;
    pxVar8 = p_Var14->name;
    iVar3 = xmlStrlen(pxVar8);
    iVar3 = xmlStrncmp(pubID,pxVar8,iVar3);
    if (iVar3 != 0) goto LAB_0013a37b;
    uVar15 = 0;
    do {
      if (uVar16 == uVar15) {
        if ((int)uVar10 < 0x32) {
          lVar9 = (long)(int)uVar10;
          uVar10 = uVar10 + 1;
          delegates[lVar9] = p_Var14->URL;
        }
        pxVar13 = p_Var14->children;
        if (pxVar13 == (xmlCatalogEntryPtr)0x0) {
          xmlFetchXMLCatalogFile(p_Var14);
          pxVar13 = p_Var14->children;
          if (pxVar13 == (xmlCatalogEntryPtr)0x0) goto LAB_0013a37b;
        }
        if (xmlDebugCatalogs != 0) {
          pp_Var6 = __xmlGenericError();
          p_Var2 = *pp_Var6;
          ppvVar7 = __xmlGenericErrorContext();
          (*p_Var2)(*ppvVar7,"Trying public delegate %s\n",p_Var14->URL);
          pxVar13 = p_Var14->children;
        }
        pxVar8 = xmlCatalogListXMLResolve(pxVar13,pubID,(xmlChar *)0x0);
        if (pxVar8 != (xmlChar *)0x0) goto LAB_0013a47f;
        goto LAB_0013a37b;
      }
      iVar3 = xmlStrEqual(p_Var14->URL,delegates[uVar15]);
      uVar15 = uVar15 + 1;
    } while (iVar3 == 0);
  }
LAB_0013a47f:
  catal_00->depth = catal_00->depth + -1;
  goto LAB_0013a260;
LAB_0013a37b:
  p_Var14 = p_Var14->next;
  goto LAB_0013a297;
}

Assistant:

static xmlChar *
xmlCatalogListXMLResolve(xmlCatalogEntryPtr catal, const xmlChar *pubID,
	              const xmlChar *sysID) {
    xmlChar *ret = NULL;
    xmlChar *urnID = NULL;
    xmlChar *normid;

    if (catal == NULL)
        return(NULL);
    if ((pubID == NULL) && (sysID == NULL))
	return(NULL);

    normid = xmlCatalogNormalizePublic(pubID);
    if (normid != NULL)
        pubID = (*normid != 0 ? normid : NULL);

    if (!xmlStrncmp(pubID, BAD_CAST XML_URN_PUBID, sizeof(XML_URN_PUBID) - 1)) {
	urnID = xmlCatalogUnWrapURN(pubID);
	if (xmlDebugCatalogs) {
	    if (urnID == NULL)
		xmlGenericError(xmlGenericErrorContext,
			"Public URN ID %s expanded to NULL\n", pubID);
	    else
		xmlGenericError(xmlGenericErrorContext,
			"Public URN ID expanded to %s\n", urnID);
	}
	ret = xmlCatalogListXMLResolve(catal, urnID, sysID);
	if (urnID != NULL)
	    xmlFree(urnID);
	if (normid != NULL)
	    xmlFree(normid);
	return(ret);
    }
    if (!xmlStrncmp(sysID, BAD_CAST XML_URN_PUBID, sizeof(XML_URN_PUBID) - 1)) {
	urnID = xmlCatalogUnWrapURN(sysID);
	if (xmlDebugCatalogs) {
	    if (urnID == NULL)
		xmlGenericError(xmlGenericErrorContext,
			"System URN ID %s expanded to NULL\n", sysID);
	    else
		xmlGenericError(xmlGenericErrorContext,
			"System URN ID expanded to %s\n", urnID);
	}
	if (pubID == NULL)
	    ret = xmlCatalogListXMLResolve(catal, urnID, NULL);
	else if (xmlStrEqual(pubID, urnID))
	    ret = xmlCatalogListXMLResolve(catal, pubID, NULL);
	else {
	    ret = xmlCatalogListXMLResolve(catal, pubID, urnID);
	}
	if (urnID != NULL)
	    xmlFree(urnID);
	if (normid != NULL)
	    xmlFree(normid);
	return(ret);
    }
    while (catal != NULL) {
	if (catal->type == XML_CATA_CATALOG) {
	    if (catal->children == NULL) {
		xmlFetchXMLCatalogFile(catal);
	    }
	    if (catal->children != NULL) {
		ret = xmlCatalogXMLResolve(catal->children, pubID, sysID);
		if (ret != NULL) {
		    break;
                } else if (catal->children->depth > MAX_CATAL_DEPTH) {
	            ret = NULL;
		    break;
	        }
	    }
	}
	catal = catal->next;
    }
    if (normid != NULL)
	xmlFree(normid);
    return(ret);
}